

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# USBControlTransfers.cpp
# Opt level: O2

void __thiscall
USBControlTransferParser::ParseDataPacket(USBControlTransferParser *this,USBPacket *packet)

{
  undefined1 uVar1;
  byte bVar2;
  int iVar3;
  USBAnalyzerResults *pUVar4;
  bool bVar5;
  mapped_type *pmVar6;
  ostream *poVar7;
  USBDescriptorType UVar8;
  int offset;
  Frame aFStack_58 [40];
  
  this->pPacket = packet;
  this->mPacketOffset = 0;
  this->mPacketDataBytes =
       (*(int *)&(packet->mData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
       *(int *)&(packet->mData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start) + -4;
  bVar5 = USBRequest::IsRequestedStandardDescriptor(&this->mRequest);
  if (!bVar5) {
    bVar5 = USBRequest::IsRequestedHIDReportDescriptor(&this->mRequest);
    if (bVar5) {
      ParseHIDReportDescriptor(this);
      return;
    }
    bVar5 = IsCDCClassRequest(this);
    if (!bVar5) {
      ParseUnknownResponse(this);
      return;
    }
    ParseCDCDataStage(this);
    return;
  }
  do {
    while( true ) {
      while( true ) {
        if (this->mPacketDataBytes <= this->mPacketOffset) {
          return;
        }
        pmVar6 = std::
                 map<unsigned_char,_USBClassCodes,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_USBClassCodes>_>_>
                 ::operator[](&this->mInterfaceClasses,&this->mInterfaceNumber);
        iVar3 = this->mParsedOffset;
        offset = (int)packet;
        if (iVar3 != 0) break;
        pUVar4 = this->pResults;
        USBPacket::GetDataPayloadField
                  ((USBPacket *)aFStack_58,offset,this->mPacketOffset,'\x01',
                   (char *)(ulong)this->mAddress,0x13bb5b,'\0');
        AnalyzerResults::AddFrame((Frame *)pUVar4);
        Frame::~Frame(aFStack_58);
        this->mDescBytes =
             (uint)(packet->mData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                   ._M_impl.super__Vector_impl_data._M_start[(long)this->mPacketOffset + 2];
        this->mPacketOffset = this->mPacketOffset + 1;
        this->mParsedOffset = this->mParsedOffset + 1;
      }
      uVar1 = (undefined1)*pmVar6;
      if (iVar3 != 1) break;
      iVar3 = this->mPacketOffset;
      bVar2 = (packet->mData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start[(long)iVar3 + 2];
      this->mDescType = (uint)bVar2;
      pUVar4 = this->pResults;
      if ((((byte)(bVar2 - 1) < 8) ||
          ((uVar1 & CC_ApplicationSpecific) == CC_CommunicationsAndCDCControl)) ||
         (uVar1 == CC_CDCData)) {
        USBPacket::GetDataPayloadField
                  ((USBPacket *)aFStack_58,offset,iVar3,'\x01',(char *)(ulong)this->mAddress,
                   0x13b504,'\x0f');
        AnalyzerResults::AddFrame((Frame *)pUVar4);
      }
      else {
        USBPacket::GetDataPayloadField
                  ((USBPacket *)aFStack_58,offset,iVar3,'\x01',(char *)(ulong)this->mAddress,
                   0x13b504,'\x10');
        AnalyzerResults::AddFrame((Frame *)pUVar4);
      }
LAB_00134adc:
      Frame::~Frame(aFStack_58);
      this->mPacketOffset = this->mPacketOffset + 1;
      this->mParsedOffset = this->mParsedOffset + 1;
    }
    if (iVar3 == 2) {
      UVar8 = this->mDescType;
      if ((UVar8 & ~DT_DEVICE) == DT_CDC_CS_INTERFACE &&
          (uVar1 & (CC_WirelessController|CC_AudioVideo|CC_Printer)) ==
          CC_CommunicationsAndCDCControl) {
        this->mDescSubtype =
             (uint)(packet->mData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                   ._M_impl.super__Vector_impl_data._M_start[(long)this->mPacketOffset + 2];
        pUVar4 = this->pResults;
        USBPacket::GetDataPayloadField
                  ((USBPacket *)aFStack_58,offset,this->mPacketOffset,'\x01',
                   (char *)(ulong)this->mAddress,0x13b526,'\x1f');
        AnalyzerResults::AddFrame((Frame *)pUVar4);
        goto LAB_00134adc;
      }
    }
    else {
      UVar8 = this->mDescType;
    }
    if (UVar8 == DT_STRING) {
      bVar5 = ParseStringDescriptor(this);
      if ((bVar5) && (this->mPacketOffset < this->mPacketDataBytes)) {
        poVar7 = std::operator<<((ostream *)&std::cerr,
                                 "String descriptor length shorter than packet length. Packet length: "
                                );
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,this->mPacketDataBytes);
        poVar7 = std::operator<<(poVar7," processed bytes: ");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,this->mPacketOffset);
        poVar7 = std::operator<<(poVar7," reported descriptor length: ");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,this->mDescBytes);
        std::operator<<(poVar7,"\n");
        return;
      }
    }
    else {
      ParseStandardDescriptor(this);
    }
  } while( true );
}

Assistant:

void USBControlTransferParser::ParseDataPacket( USBPacket& packet )
{
    pPacket = &packet;
    mPacketOffset = 0;
    mPacketDataBytes = packet.mData.size() - 4;

    if( mRequest.IsRequestedStandardDescriptor() )
    {
        while( mPacketDataBytes > mPacketOffset )
        {
            U8 interfaceClass = mInterfaceClasses[ mInterfaceNumber ];

            if( mParsedOffset == 0 ) // are we just starting with this descriptor?
            {
                // handle the bLength field
                pResults->AddFrame( packet.GetDataPayloadField( mPacketOffset, 1, mAddress, "bLength", Fld_None, FF_DataDescriptor ) );
                mDescBytes = packet.GetDataPayload( mPacketOffset, 1 );
                ++mPacketOffset;
                ++mParsedOffset;
            }
            else if( mParsedOffset == 1 )
            {
                mDescType = USBDescriptorType( packet.GetDataPayload( mPacketOffset, 1 ) );

                if( IsStandardDescriptor( mDescType ) || interfaceClass == CC_HID || interfaceClass == CC_CommunicationsAndCDCControl ||
                    interfaceClass == CC_CDCData )
                    pResults->AddFrame( packet.GetDataPayloadField( mPacketOffset, 1, mAddress, "bDescriptorType", Fld_bDescriptorType ) );
                else
                    pResults->AddFrame(
                        packet.GetDataPayloadField( mPacketOffset, 1, mAddress, "bDescriptorType", Fld_bDescriptorType_Other ) );

                ++mPacketOffset;
                ++mParsedOffset;
            }
            else if( mParsedOffset == 2 && ( interfaceClass == CC_CommunicationsAndCDCControl || interfaceClass == CC_CDCData ) &&
                     ( mDescType == DT_CDC_CS_INTERFACE || mDescType == DT_CDC_CS_ENDPOINT ) )
            {
                mDescSubtype = USBCDCDescriptorSubtype( packet.GetDataPayload( mPacketOffset, 1 ) );
                pResults->AddFrame(
                    packet.GetDataPayloadField( mPacketOffset, 1, mAddress, "bDescriptorSubtype", Fld_CDC_DescriptorSubtype ) );

                ++mPacketOffset;
                ++mParsedOffset;
            }
            else
            {
                if( mDescType == DT_STRING )
                {
                    bool detected_complete_descriptor = ParseStringDescriptor();
                    if( detected_complete_descriptor && mPacketDataBytes > mPacketOffset )
                    {
                        // we finished parsing the complete string descriptor, according to bLength, however there are still bytes left in
                        // the packet.
                        std::cerr << "String descriptor length shorter than packet length. Packet length: " << mPacketDataBytes
                                  << " processed bytes: " << mPacketOffset << " reported descriptor length: " << mDescBytes << "\n";
                        break;
                    }
                }
                else
                {
                    ParseStandardDescriptor();
                }
            }
        }
    }
    else if( mRequest.IsRequestedHIDReportDescriptor() )
    {
        ParseHIDReportDescriptor();
    }
    else if( IsCDCClassRequest() )
    {
        ParseCDCDataStage();
    }
    else
    {
        ParseUnknownResponse();
    }
}